

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

char ** readdir_raw(char *dir,int return_subdirs,char *mask)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  DIR *__dirp;
  dirent *pdVar6;
  char *pcVar7;
  char **ppcVar8;
  char **results;
  char *local_3048;
  undefined8 local_3040;
  char buffer [4096];
  char buffer_1 [4096];
  char with_slash [4096];
  
  results = (char **)0x0;
  local_3048 = mask;
  sVar4 = stb_strscpy(buffer,dir,0x1000);
  if (0xfffffffffffff000 < sVar4 - 0x1000) {
    stb_fixpath(buffer);
    sVar5 = sVar4 - 1;
    if (sVar5 == 0) {
      sVar5 = 0;
    }
    else if (buffer[sVar4 - 2] != '/') {
      buffer[sVar4 - 1] = '/';
      sVar5 = sVar4;
    }
    buffer[sVar5] = '\0';
    sVar4 = stb_strscpy(with_slash,buffer,0x1000);
    if ((sVar4 != 0) && (__dirp = opendir(dir), __dirp != (DIR *)0x0)) {
      pdVar6 = readdir(__dirp);
      if (pdVar6 == (dirent *)0x0) {
        ppcVar8 = (char **)0x0;
      }
      else {
        local_3040 = buffer + sVar5;
        ppcVar8 = (char **)0x0;
        do {
          pcVar7 = pdVar6->d_name;
          sVar4 = stb_strscpy(local_3040,pcVar7,0x1000 - sVar5);
          if (sVar4 == 0) break;
          uVar2 = pdVar6->d_type & 4;
          if (uVar2 >> 2 == return_subdirs) {
            if (((char)uVar2 != '\0') && (*pcVar7 == '.')) {
              cVar1 = pdVar6->d_name[1];
              if (cVar1 == '.') {
                cVar1 = pdVar6->d_name[2];
              }
              if (cVar1 == '\0') goto LAB_00151163;
            }
            if ((local_3048 == (char *)0x0) ||
               (iVar3 = stb_wildmatchi(local_3048,pcVar7), iVar3 != 0)) {
              iVar3 = stb_snprintf(buffer_1,0x1000,"%s%s",with_slash,pcVar7);
              ppcVar8 = results;
              if (iVar3 < 0) break;
              pcVar7 = strdup(buffer_1 + (ulong)(buffer_1[1] == '/' && buffer_1[0] == '.') * 2);
              if ((results == (char **)0x0) ||
                 (*(int *)((long)results + -0xc) <= *(int *)(results + -2))) {
                stb__arr_addlen_(&results,8,1);
              }
              else {
                *(int *)(results + -2) = *(int *)(results + -2) + 1;
              }
              results[(long)*(int *)(results + -2) + -1] = pcVar7;
              ppcVar8 = results;
            }
          }
LAB_00151163:
          pdVar6 = readdir(__dirp);
        } while (pdVar6 != (dirent *)0x0);
      }
      closedir(__dirp);
      return ppcVar8;
    }
  }
  return (char **)0x0;
}

Assistant:

static char **readdir_raw(char *dir, int return_subdirs, char *mask)
{
   char **results = NULL;
   char buffer[4096], with_slash[4096];
   size_t n;

   #ifdef _MSC_VER
      stb__wchar *ws;
      struct _wfinddata_t data;
   #ifdef _WIN64
      const intptr_t none = -1;
      intptr_t z;
   #else
      const long none = -1;
      long z;
   #endif
   #else // !_MSC_VER
      const DIR *none = NULL;
      DIR *z;
   #endif

   n = stb_strscpy(buffer,dir,sizeof(buffer));
   if (!n || n >= sizeof(buffer))
      return NULL;
   stb_fixpath(buffer);
   n--;

   if (n > 0 && (buffer[n-1] != '/')) {
      buffer[n++] = '/';
   }
   buffer[n] = 0;
   if (!stb_strscpy(with_slash,buffer,sizeof(with_slash)))
      return NULL;

   #ifdef _MSC_VER
      if (!stb_strscpy(buffer+n,"*.*",sizeof(buffer)-n))
         return NULL;
      ws = stb__from_utf8(buffer);
      z = _wfindfirst((const wchar_t *)ws, &data);
   #else
      z = opendir(dir);
   #endif

   if (z != none) {
      int nonempty = STB_TRUE;
      #ifndef _MSC_VER
      struct dirent *data = readdir(z);
      nonempty = (data != NULL);
      #endif

      if (nonempty) {

         do {
            int is_subdir;
            #ifdef _MSC_VER
            char *name = stb__to_utf8((stb__wchar *)data.name);
            if (name == NULL) {
               fprintf(stderr, "%s to convert '%S' to %s!\n", "Unable", data.name, "utf8");
               continue;
            }
            is_subdir = !!(data.attrib & _A_SUBDIR);
            #else
            char *name = data->d_name;
            if (!stb_strscpy(buffer+n,name,sizeof(buffer)-n))
               break;
            // Could follow DT_LNK, but would need to check for recursive links.
            is_subdir = !!(data->d_type & DT_DIR);
            #endif

            if (is_subdir == return_subdirs) {
               if (!is_subdir || !isdotdirname(name)) {
                  if (!mask || stb_wildmatchi(mask, name)) {
                     char buffer[4096],*p=buffer;
                     if ( stb_snprintf(buffer, sizeof(buffer), "%s%s", with_slash, name) < 0 )
                        break;
                     if (buffer[0] == '.' && buffer[1] == '/')
                        p = buffer+2;
                     stb_arr_push(results, strdup(p));
                  }
               }
            }
         }
         #ifdef _MSC_VER
         while (0 == _wfindnext(z, &data));
         #else
         while ((data = readdir(z)) != NULL);
         #endif
      }
      #ifdef _MSC_VER
         _findclose(z);
      #else
         closedir(z);
      #endif
   }
   return results;
}